

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr
          (ExceptionOr<kj::HttpClient::WebSocketResponse> *this,WebSocketResponse *value)

{
  (this->super_ExceptionOrValue).exception.ptr.isSet = false;
  NullableValue<kj::HttpClient::WebSocketResponse>::NullableValue(&(this->value).ptr,value);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}